

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O0

void restore_oracles(memfile *mf)

{
  int32_t iVar1;
  uint local_14;
  int i;
  memfile *mf_local;
  
  oracle_cnt = mread32(mf);
  if (oracle_cnt != 0) {
    oracle_loc = (int *)malloc((ulong)oracle_cnt << 2);
    for (local_14 = 0; local_14 < oracle_cnt; local_14 = local_14 + 1) {
      iVar1 = mread32(mf);
      oracle_loc[(int)local_14] = iVar1;
    }
    oracle_flg = 1;
  }
  return;
}

Assistant:

void restore_oracles(struct memfile *mf)
{
	int i;
	oracle_cnt = mread32(mf);
	if (oracle_cnt) {
	    oracle_loc = malloc(oracle_cnt * sizeof(int));
	    for (i = 0; i < oracle_cnt; i++)
		oracle_loc[i] = mread32(mf);
	    oracle_flg = 1;	/* no need to call init_oracles() */
	}
}